

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5714b::type_schema::validate
          (type_schema *this,json_pointer *ptr,json *instance,json_patch *patch,error_handler *e)

{
  value_t vVar1;
  binary_t *pbVar2;
  array_t *paVar3;
  pointer psVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  bool bVar6;
  reference rhs;
  element_type *peVar7;
  pointer psVar8;
  const_iterator __begin3;
  string_t local_c8;
  undefined1 local_a8 [40];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_80;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  type_schema *local_48;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_40;
  
  psVar8 = (this->type_).
           super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar7 = psVar8[instance->m_type].
           super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_50 = psVar8[instance->m_type].
             super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_50->_M_use_count = local_50->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_50->_M_use_count = local_50->_M_use_count + 1;
    }
  }
  if (peVar7 == (element_type *)0x0) {
    local_a8._0_8_ = (pointer)(local_a8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a8,"unexpected instance type","");
    (*e->_vptr_error_handler[2])(e,ptr,instance,local_a8);
    if ((pointer)local_a8._0_8_ != (pointer)(local_a8 + 0x10)) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_a8._16_8_ + 1));
    }
  }
  else {
    (**(code **)((long)peVar7->_vptr_schema + 0x18))(peVar7,ptr,instance,patch,e);
  }
  if ((this->enum_).first != true) goto LAB_00123604;
  local_c8._M_dataplus._M_p = (pointer)&(this->enum_).second;
  local_a8._8_8_ = (_Rb_tree_node_base *)0x0;
  local_a8._16_8_ = (pointer)0x0;
  local_a8._24_8_ = -0x8000000000000000;
  vVar1 = (this->enum_).second.m_type;
  if (vVar1 == null) {
    local_a8._24_8_ = 1;
LAB_00123542:
    local_c8._M_string_length = 0;
    local_c8.field_2._M_allocated_capacity = 0;
    local_c8.field_2._8_8_ = 1;
  }
  else if (vVar1 == array) {
    paVar3 = (this->enum_).second.m_value.array;
    local_a8._16_8_ =
         (paVar3->
         super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_c8._M_string_length = 0;
    local_c8.field_2._8_8_ = 0x8000000000000000;
    local_c8.field_2._M_allocated_capacity =
         (size_type)
         (paVar3->
         super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    if (vVar1 != object) {
      local_a8._24_8_ = 0;
      goto LAB_00123542;
    }
    pbVar2 = (this->enum_).second.m_value.binary;
    local_a8._8_8_ = pbVar2->m_subtype;
    local_c8.field_2._M_allocated_capacity = 0;
    local_c8.field_2._8_8_ = 0x8000000000000000;
    local_c8._M_string_length =
         (size_type)
         &(pbVar2->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish;
  }
  local_a8._0_8_ = local_c8._M_dataplus._M_p;
  while (bVar6 = nlohmann::json_abi_v3_11_2::detail::
                 iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::
                 operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                           ((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)local_a8,
                            (iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_c8), !bVar6) {
    rhs = nlohmann::json_abi_v3_11_2::detail::
          iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)local_a8);
    bVar6 = nlohmann::json_abi_v3_11_2::operator==(instance,rhs);
    if (bVar6) goto LAB_00123604;
    if (*(value_t *)local_a8._0_8_ == array) {
      local_a8._16_8_ = local_a8._16_8_ + 0x10;
    }
    else if (*(value_t *)local_a8._0_8_ == object) {
      local_a8._8_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_a8._8_8_);
    }
    else {
      local_a8._24_8_ = local_a8._24_8_ + 1;
    }
  }
  local_a8._0_8_ = (pointer)(local_a8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a8,"instance not found in required enum","");
  (*e->_vptr_error_handler[2])(e,ptr,instance,local_a8);
  if ((pointer)local_a8._0_8_ != (pointer)(local_a8 + 0x10)) {
    operator_delete((void *)local_a8._0_8_,(ulong)(local_a8._16_8_ + 1));
  }
LAB_00123604:
  if (((this->const_).first == true) &&
     (bVar6 = nlohmann::json_abi_v3_11_2::operator!=(&(this->const_).second,instance), bVar6)) {
    local_a8._0_8_ = (pointer)(local_a8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"instance not const","");
    (*e->_vptr_error_handler[2])(e,ptr,instance,local_a8);
    if ((pointer)local_a8._0_8_ != (pointer)(local_a8 + 0x10)) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_a8._16_8_ + 1));
    }
  }
  psVar4 = (this->logic_).
           super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  p_Var5 = local_50;
  for (psVar8 = (this->logic_).
                super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
                ._M_impl.super__Vector_impl_data._M_start; local_50 = p_Var5, local_48 = this,
      psVar8 != psVar4; psVar8 = psVar8 + 1) {
    peVar7 = (psVar8->super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>)
             ._M_ptr;
    p_Var5 = (psVar8->super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>)
             ._M_refcount._M_pi;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      }
    }
    (*peVar7->_vptr_schema[3])(peVar7,ptr,instance,patch,e);
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    }
    this = local_48;
    p_Var5 = local_50;
  }
  if ((this->if_).super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    local_a8._0_8_ = &PTR__first_error_handler_0015a698;
    local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
    local_c8._M_string_length = 0;
    local_c8.field_2._M_allocated_capacity =
         local_c8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    nlohmann::json_abi_v3_11_2::
    json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)(local_a8 + 0x10),&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,(ulong)(local_c8.field_2._M_allocated_capacity + 1))
      ;
    }
    local_80.m_type = null;
    local_80.m_value.object = (object_t *)0x0;
    local_68 = 0;
    local_60 = 0;
    peVar7 = (this->if_).
             super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_70 = &local_60;
    (*peVar7->_vptr_schema[3])(peVar7,ptr,instance,patch,local_a8);
    if (local_a8[8] == '\0') {
      peVar7 = (this->then_).
               super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    else {
      peVar7 = (this->else_).
               super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    if (peVar7 != (element_type *)0x0) {
      (*peVar7->_vptr_schema[3])(peVar7,ptr,instance,patch,e);
    }
    local_a8._0_8_ = &PTR__first_error_handler_0015a698;
    if (local_70 != &local_60) {
      operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_80);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_a8 + 0x10));
  }
  if (instance->m_type == null) {
    local_a8._0_8_ = (pointer)(local_a8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"");
    nlohmann::json_abi_v3_11_2::
    json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_c8,(string_t *)local_a8);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json(&local_40,&(this->super_schema).default_value_);
    nlohmann::json_patch::add(patch,(json_pointer *)&local_c8,&local_40);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_40);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_c8);
    if ((pointer)local_a8._0_8_ != (pointer)(local_a8 + 0x10)) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_a8._16_8_ + 1));
    }
  }
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  return;
}

Assistant:

void validate(const json::json_pointer &ptr, const json &instance, json_patch &patch, error_handler &e) const override final
	{
		// depending on the type of instance run the type specific validator - if present
		auto type = type_[static_cast<uint8_t>(instance.type())];

		if (type)
			type->validate(ptr, instance, patch, e);
		else
			e.error(ptr, instance, "unexpected instance type");

		if (enum_.first) {
			bool seen_in_enum = false;
			for (auto &v : enum_.second)
				if (instance == v) {
					seen_in_enum = true;
					break;
				}

			if (!seen_in_enum)
				e.error(ptr, instance, "instance not found in required enum");
		}

		if (const_.first &&
		    const_.second != instance)
			e.error(ptr, instance, "instance not const");

		for (auto l : logic_)
			l->validate(ptr, instance, patch, e);

		if (if_) {
			first_error_handler err;

			if_->validate(ptr, instance, patch, err);
			if (!err) {
				if (then_)
					then_->validate(ptr, instance, patch, e);
			} else {
				if (else_)
					else_->validate(ptr, instance, patch, e);
			}
		}
		if (instance.is_null()) {
			patch.add(nlohmann::json::json_pointer{}, default_value_);
		}
	}